

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

void sockhash_destroy(Curl_hash *h)

{
  Curl_hash_element *pCVar1;
  Curl_hash_iterator iter;
  Curl_hash_iterator CStack_28;
  
  Curl_hash_start_iterate(h,&CStack_28);
  pCVar1 = Curl_hash_next_element(&CStack_28);
  while (pCVar1 != (Curl_hash_element *)0x0) {
    Curl_hash_destroy((Curl_hash *)pCVar1->ptr);
    pCVar1 = Curl_hash_next_element(&CStack_28);
  }
  Curl_hash_destroy(h);
  return;
}

Assistant:

static void sockhash_destroy(struct Curl_hash *h)
{
  struct Curl_hash_iterator iter;
  struct Curl_hash_element *he;

  DEBUGASSERT(h);
  Curl_hash_start_iterate(h, &iter);
  he = Curl_hash_next_element(&iter);
  while(he) {
    struct Curl_sh_entry *sh = (struct Curl_sh_entry *)he->ptr;
    Curl_hash_destroy(&sh->transfers);
    he = Curl_hash_next_element(&iter);
  }
  Curl_hash_destroy(h);
}